

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          Options *options)

{
  bool bVar1;
  Type TVar2;
  Descriptor *desc;
  allocator local_61;
  string local_60;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *field_local;
  
  local_20 = (Options *)field;
  options_local = (Options *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\\Google\\Protobuf\\Internal\\MapField",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)options_local);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"\\Google\\Protobuf\\Internal\\RepeatedField",
                 local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
    else {
      TVar2 = FieldDescriptor::type((FieldDescriptor *)options_local);
      switch(TVar2) {
      case TYPE_DOUBLE:
      case TYPE_FLOAT:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"float",&local_38);
        std::allocator<char>::~allocator((allocator<char> *)&local_38);
        break;
      case TYPE_INT64:
      case TYPE_UINT64:
      case TYPE_FIXED64:
      case TYPE_SFIXED64:
      case MAX_TYPE:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"int|string",&local_37);
        std::allocator<char>::~allocator((allocator<char> *)&local_37);
        break;
      case TYPE_INT32:
      case TYPE_FIXED32:
      case TYPE_UINT32:
      case TYPE_ENUM:
      case TYPE_SFIXED32:
      case TYPE_SINT32:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_36);
        std::allocator<char>::~allocator((allocator<char> *)&local_36);
        break;
      case TYPE_BOOL:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",&local_39);
        std::allocator<char>::~allocator((allocator<char> *)&local_39);
        break;
      case TYPE_STRING:
      case TYPE_BYTES:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"string",&local_3a);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a);
        break;
      case TYPE_GROUP:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"null",&local_61);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        break;
      case TYPE_MESSAGE:
        desc = FieldDescriptor::message_type((FieldDescriptor *)options_local);
        anon_unknown_2::FullClassName<google::protobuf::Descriptor>(&local_60,desc,local_20);
        std::operator+(__return_storage_ptr__,"\\",&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                      ,0x216,
                      "std::string google::protobuf::compiler::php::(anonymous namespace)::PhpGetterTypeName(const FieldDescriptor *, const Options &)"
                     );
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PhpGetterTypeName(const FieldDescriptor* field,
                              const Options& options) {
  if (field->is_map()) {
    return "\\Google\\Protobuf\\Internal\\MapField";
  }
  if (field->is_repeated()) {
    return "\\Google\\Protobuf\\Internal\\RepeatedField";
  }
  switch (field->type()) {
    case FieldDescriptor::TYPE_INT32:
    case FieldDescriptor::TYPE_UINT32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_ENUM: return "int";
    case FieldDescriptor::TYPE_INT64:
    case FieldDescriptor::TYPE_UINT64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_SFIXED64: return "int|string";
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT: return "float";
    case FieldDescriptor::TYPE_BOOL: return "bool";
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: return "string";
    case FieldDescriptor::TYPE_MESSAGE:
      return "\\" + FullClassName(field->message_type(), options);
    case FieldDescriptor::TYPE_GROUP: return "null";
    default: assert(false); return "";
  }
}